

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity,REF_DBL *min_del,REF_DBL *min_add)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  REF_DBL quality;
  double *local_d0;
  REF_DBL *local_c8;
  long local_c0;
  REF_DBL r1;
  REF_DBL r0;
  REF_INT nodes [27];
  
  ref_node = ref_cavity->ref_grid->node;
  ref_cell = ref_cavity->ref_grid->cell[8];
  iVar1 = ref_cavity->node;
  *min_del = -2.0;
  *min_add = -2.0;
  uVar13 = 0;
  dVar14 = 1.0;
  local_d0 = min_del;
  local_c8 = min_add;
  while ((long)uVar13 < (long)ref_cavity->tet_list->n) {
    uVar4 = ref_cell_nodes(ref_cell,ref_cavity->tet_list->value[uVar13],nodes);
    if (uVar4 != 0) {
      pcVar12 = "cell";
      uVar7 = 0x93f;
      goto LAB_00146cfa;
    }
    uVar4 = ref_node_tet_quality(ref_node,nodes,&quality);
    if (uVar4 != 0) {
      pcVar12 = "new qual";
      uVar7 = 0x940;
      goto LAB_00146cfa;
    }
    uVar13 = uVar13 + 1;
    if (quality <= dVar14) {
      dVar14 = quality;
    }
  }
  if ((int)uVar13 != 0 && ref_cavity->debug != 0) {
    printf("- min %12.8f avg %12.8f n %d\n");
  }
  *local_d0 = dVar14;
  dVar14 = 1.0;
  dVar15 = 0.0;
  lVar11 = 0;
  uVar10 = 0;
  for (lVar8 = 0; iVar9 = (int)uVar10, lVar8 < ref_cavity->maxface; lVar8 = lVar8 + 1) {
    pRVar2 = ref_cavity->f2n;
    if (pRVar2[lVar8 * 3] != -1) {
      bVar3 = false;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        if (iVar1 == *(int *)((long)pRVar2 + lVar6 * 4 + lVar11)) {
          bVar3 = true;
        }
      }
      if (!bVar3) {
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          nodes[lVar6] = *(REF_INT *)((long)pRVar2 + lVar6 * 4 + lVar11);
        }
        local_c0 = lVar11;
        nodes[3] = iVar1;
        uVar4 = ref_node_tet_quality(ref_node,nodes,&quality);
        if (uVar4 != 0) {
          pcVar12 = "new qual";
          uVar7 = 0x95b;
          goto LAB_00146cfa;
        }
        uVar10 = (ulong)(iVar9 + 1);
        dVar15 = dVar15 + quality;
        lVar11 = local_c0;
        if (quality <= dVar14) {
          dVar14 = quality;
        }
      }
    }
    lVar11 = lVar11 + 0xc;
  }
  iVar5 = ref_cavity->debug;
  if (0 < iVar9 && iVar5 != 0) {
    printf("+ min %12.8f avg %12.8f n %d\n",dVar14,dVar15 / (double)iVar9);
    iVar5 = ref_cavity->debug;
  }
  *local_c8 = dVar14;
  if ((iVar5 == 0) ||
     (printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n",dVar14,*local_d0,dVar14 - *local_d0,
             uVar10,uVar13 & 0xffffffff), ref_cavity->debug == 0)) {
    return 0;
  }
  lVar11 = 4;
  lVar8 = 0;
  do {
    if (ref_cavity->maxseg <= lVar8) {
      return 0;
    }
    iVar9 = *(int *)((long)ref_cavity->s2n + lVar11 + -4);
    if ((iVar1 != iVar9 && iVar9 != -1) && (iVar1 != *(int *)((long)ref_cavity->s2n + lVar11))) {
      iVar5 = ref_cavity->surf_node;
      if (iVar5 == -1) {
        iVar5 = ref_cavity->node;
      }
      uVar4 = ref_node_ratio(ref_node,iVar5,iVar9,&r0);
      if (uVar4 != 0) {
        pcVar12 = "ratio";
        uVar7 = 0x974;
LAB_00146cfa:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar7,"ref_cavity_change",(ulong)uVar4,pcVar12);
        return uVar4;
      }
      iVar9 = ref_cavity->surf_node;
      if (iVar9 == -1) {
        iVar9 = ref_cavity->node;
      }
      uVar4 = ref_node_ratio(ref_node,iVar9,*(REF_INT *)((long)ref_cavity->s2n + lVar11),&r1);
      if (uVar4 != 0) {
        pcVar12 = "ratio";
        uVar7 = 0x977;
        goto LAB_00146cfa;
      }
      printf("+ ratio %f %f\n",r0,r1);
    }
    lVar8 = lVar8 + 1;
    lVar11 = lVar11 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity, REF_DBL *min_del,
                                     REF_DBL *min_add) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality, total_quality;
  REF_INT face, face_node, n, n_del, n_add;
  REF_BOOL skip;

  *min_del = -2.0;
  *min_add = -2.0;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("- min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_del = min_quality;
  n_del = n;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      nodes[face_node] = ref_cavity_f2n(ref_cavity, face_node, face);
    }
    nodes[3] = node;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("+ min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_add = min_quality;
  n_add = n;

  if (ref_cavity_debug(ref_cavity))
    printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n", *min_add, *min_del,
           *min_add - *min_del, n_add, n_del);

  if (ref_cavity_debug(ref_cavity)) {
    REF_INT seg;
    REF_DBL r0, r1;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 0, seg), &r0),
          "ratio");
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 1, seg), &r1),
          "ratio");
      printf("+ ratio %f %f\n", r0, r1);
    }
  }

  return REF_SUCCESS;
}